

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_string(lys_module *module,char **target,char *what,char *where,char *value,
                     lys_node *node)

{
  char *pcVar1;
  LY_VLOG_ELEM elem_type;
  lys_node *node_local;
  char *value_local;
  char *where_local;
  char *what_local;
  char **target_local;
  lys_module *module_local;
  
  if (*target == (char *)0x0) {
    pcVar1 = lydict_insert_zc(module->ctx,value);
    *target = pcVar1;
    module_local._4_4_ = 0;
  }
  else {
    elem_type = LY_VLOG_NONE;
    if (node != (lys_node *)0x0) {
      elem_type = LY_VLOG_LYS;
    }
    ly_vlog(LYE_TOOMANY,elem_type,node,what,where);
    free(value);
    module_local._4_4_ = 1;
  }
  return module_local._4_4_;
}

Assistant:

static int
yang_check_string(struct lys_module *module, const char **target, char *what,
                  char *where, char *value, struct lys_node *node)
{
    if (*target) {
        LOGVAL(LYE_TOOMANY, (node) ? LY_VLOG_LYS : LY_VLOG_NONE, node, what, where);
        free(value);
        return 1;
    } else {
        *target = lydict_insert_zc(module->ctx, value);
        return 0;
    }
}